

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

bigint * __thiscall fmt::v11::detail::bigint::operator<<=(bigint *this,int shift)

{
  uint uVar1;
  char cVar2;
  size_t sVar3;
  uint *puVar4;
  int in_ESI;
  bigint *in_RDI;
  bigit c;
  size_t n;
  size_t i;
  bigit carry;
  undefined4 in_stack_ffffffffffffffb8;
  uint in_stack_ffffffffffffffbc;
  ulong local_28;
  uint local_1c;
  bool local_15;
  int local_14;
  bigint *local_8;
  
  local_15 = -1 < in_ESI;
  local_14 = in_ESI;
  ignore_unused<bool,char[1]>(&local_15,(char (*) [1])0x1acb1a);
  in_RDI->exp_ = local_14 / 0x20 + in_RDI->exp_;
  local_14 = local_14 % 0x20;
  local_8 = in_RDI;
  if (local_14 != 0) {
    local_1c = 0;
    local_28 = 0;
    sVar3 = buffer<unsigned_int>::size((buffer<unsigned_int> *)in_RDI);
    for (; local_28 < sVar3; local_28 = local_28 + 1) {
      puVar4 = buffer<unsigned_int>::operator[]<unsigned_long>
                         ((buffer<unsigned_int> *)in_RDI,local_28);
      uVar1 = *puVar4;
      cVar2 = (char)local_14;
      puVar4 = buffer<unsigned_int>::operator[]<unsigned_long>
                         ((buffer<unsigned_int> *)in_RDI,local_28);
      in_stack_ffffffffffffffbc = (*puVar4 << ((byte)local_14 & 0x1f)) + local_1c;
      puVar4 = buffer<unsigned_int>::operator[]<unsigned_long>
                         ((buffer<unsigned_int> *)in_RDI,local_28);
      *puVar4 = in_stack_ffffffffffffffbc;
      local_1c = uVar1 >> (0x20U - cVar2 & 0x1f);
    }
    local_8 = in_RDI;
    if (local_1c != 0) {
      buffer<unsigned_int>::push_back
                ((buffer<unsigned_int> *)in_RDI,
                 (uint *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
      local_8 = in_RDI;
    }
  }
  return local_8;
}

Assistant:

FMT_CONSTEXPR auto operator<<=(int shift) -> bigint& {
    FMT_ASSERT(shift >= 0, "");
    exp_ += shift / bigit_bits;
    shift %= bigit_bits;
    if (shift == 0) return *this;
    bigit carry = 0;
    for (size_t i = 0, n = bigits_.size(); i < n; ++i) {
      bigit c = bigits_[i] >> (bigit_bits - shift);
      bigits_[i] = (bigits_[i] << shift) + carry;
      carry = c;
    }
    if (carry != 0) bigits_.push_back(carry);
    return *this;
  }